

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode Curl_parse_port(Curl_URL *u,dynbuf *host,_Bool has_scheme)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  CURLUcode CVar5;
  char *pcVar6;
  bool bVar7;
  char endbracket;
  int len;
  char *rest;
  char portbuf [7];
  char local_4d;
  int local_4c;
  Curl_URL *local_48;
  char *local_40;
  char local_37 [7];
  
  pcVar3 = Curl_dyn_ptr(host);
  iVar2 = __isoc99_sscanf(pcVar3,"[%*45[0123456789abcdefABCDEF:.]%c%n",&local_4d,&local_4c);
  iVar1 = local_4c;
  if (iVar2 == 1) {
    if (local_4d == '%') {
      local_48 = u;
      iVar2 = __isoc99_sscanf(pcVar3 + local_4c,"%*[^]]%c%n",&local_4d,&local_4c);
      local_4c = local_4c + iVar1;
      u = local_48;
      if (local_4d != ']' || iVar2 != 1) {
        return CURLUE_BAD_IPV6;
      }
    }
    else if (local_4d != ']') {
      return CURLUE_BAD_IPV6;
    }
    pcVar6 = pcVar3 + local_4c;
    if (pcVar6 != (char *)0x0) {
      if (*pcVar6 == ':') goto LAB_005bbfad;
      if (*pcVar6 != '\0') {
        return CURLUE_BAD_IPV6;
      }
    }
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = strchr(pcVar3,0x3a);
  }
LAB_005bbfad:
  if (pcVar6 == (char *)0x0) {
    return CURLUE_OK;
  }
  Curl_dyn_setlen(host,(long)pcVar6 - (long)pcVar3);
  if (pcVar6[1] == '\0') {
    CVar5 = (uint)!has_scheme << 2;
  }
  else {
    CVar5 = CURLUE_BAD_PORT_NUMBER;
    if ((((byte)(pcVar6[1] - 0x30U) < 10) &&
        (lVar4 = strtol(pcVar6 + 1,&local_40,10), lVar4 < 0x10000)) && (*local_40 == '\0')) {
      *local_40 = '\0';
      curl_msnprintf(local_37,7,"%ld",lVar4);
      u->portnum = lVar4;
      pcVar3 = (*Curl_cstrdup)(local_37);
      u->port = pcVar3;
      bVar7 = pcVar3 != (char *)0x0;
      CVar5 = CURLUE_OUT_OF_MEMORY;
      if (bVar7) {
        CVar5 = CURLUE_BAD_IPV6;
      }
      goto LAB_005bc063;
    }
  }
  bVar7 = false;
LAB_005bc063:
  if (bVar7) {
    return CURLUE_OK;
  }
  return CVar5;
}

Assistant:

UNITTEST CURLUcode Curl_parse_port(struct Curl_URL *u, struct dynbuf *host,
                                   bool has_scheme)
{
  char *portptr = NULL;
  char endbracket;
  int len;
  char *hostname = Curl_dyn_ptr(host);
  /*
   * Find the end of an IPv6 address, either on the ']' ending bracket or
   * a percent-encoded zone index.
   */
  if(1 == sscanf(hostname, "[%*45[0123456789abcdefABCDEF:.]%c%n",
                 &endbracket, &len)) {
    if(']' == endbracket)
      portptr = &hostname[len];
    else if('%' == endbracket) {
      int zonelen = len;
      if(1 == sscanf(hostname + zonelen, "%*[^]]%c%n", &endbracket, &len)) {
        if(']' != endbracket)
          return CURLUE_BAD_IPV6;
        portptr = &hostname[--zonelen + len + 1];
      }
      else
        return CURLUE_BAD_IPV6;
    }
    else
      return CURLUE_BAD_IPV6;

    /* this is a RFC2732-style specified IP-address */
    if(portptr && *portptr) {
      if(*portptr != ':')
        return CURLUE_BAD_IPV6;
    }
    else
      portptr = NULL;
  }
  else
    portptr = strchr(hostname, ':');

  if(portptr) {
    char *rest;
    long port;
    char portbuf[7];
    size_t keep = portptr - hostname;

    /* Browser behavior adaptation. If there's a colon with no digits after,
       just cut off the name there which makes us ignore the colon and just
       use the default port. Firefox, Chrome and Safari all do that.

       Don't do it if the URL has no scheme, to make something that looks like
       a scheme not work!
    */
    Curl_dyn_setlen(host, keep);
    portptr++;
    if(!*portptr)
      return has_scheme ? CURLUE_OK : CURLUE_BAD_PORT_NUMBER;

    if(!ISDIGIT(*portptr))
      return CURLUE_BAD_PORT_NUMBER;

    port = strtol(portptr, &rest, 10);  /* Port number must be decimal */

    if(port > 0xffff)
      return CURLUE_BAD_PORT_NUMBER;

    if(rest[0])
      return CURLUE_BAD_PORT_NUMBER;

    *rest = 0;
    /* generate a new port number string to get rid of leading zeroes etc */
    msnprintf(portbuf, sizeof(portbuf), "%ld", port);
    u->portnum = port;
    u->port = strdup(portbuf);
    if(!u->port)
      return CURLUE_OUT_OF_MEMORY;
  }

  return CURLUE_OK;
}